

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O2

void adjust_grid(void)

{
  double (*padVar1) [50];
  Vertex *pVVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  
  padVar1 = p;
  pVVar2 = vertex;
  for (lVar3 = 0; pdVar4 = *padVar1, lVar5 = 8, lVar3 != 0x32; lVar3 = lVar3 + 1) {
    for (; lVar5 != 0x4b8; lVar5 = lVar5 + 0x18) {
      *(float *)((long)&pVVar2->x + lVar5) = (float)(*pdVar4 * 0.02);
      pdVar4 = pdVar4 + 0x32;
    }
    padVar1 = (double (*) [50])((long)padVar1 + 8);
    pVVar2 = pVVar2 + 0x32;
  }
  return;
}

Assistant:

void adjust_grid(void)
{
    int pos;
    int x, y;

    for (y = 0; y < GRIDH;  y++)
    {
        for (x = 0;  x < GRIDW;  x++)
        {
            pos = y * GRIDW + x;
            vertex[pos].z = (float) (p[x][y] * (1.0 / 50.0));
        }
    }
}